

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strifeweapons.cpp
# Opt level: O3

int AF_A_FireMauler2Pre(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  PClass *pPVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  undefined4 extraout_var;
  PClass *pPVar7;
  DPSprite *pDVar8;
  AActor *ent;
  VMValue *pVVar9;
  char *__assertion;
  bool bVar10;
  bool bVar11;
  FSoundID local_2c;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005f9e4a;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    ent = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (ent == (AActor *)0x0) {
LAB_005f9c88:
        ent = (AActor *)0x0;
        pVVar9 = param;
        uVar5 = numparam;
      }
      else {
        pPVar7 = (ent->super_DThinker).super_DObject.Class;
        if (pPVar7 == (PClass *)0x0) {
          iVar4 = (**(ent->super_DThinker).super_DObject._vptr_DObject)(ent);
          pPVar7 = (PClass *)CONCAT44(extraout_var,iVar4);
          (ent->super_DThinker).super_DObject.Class = pPVar7;
        }
        bVar10 = pPVar7 == (PClass *)0x0;
        ret = (VMReturn *)(ulong)!bVar10;
        bVar11 = pPVar7 == pPVar3;
        if (!bVar11 && !bVar10) {
          do {
            pPVar7 = pPVar7->ParentClass;
            ret = (VMReturn *)(ulong)(pPVar7 != (PClass *)0x0);
            if (pPVar7 == pPVar3) break;
          } while (pPVar7 != (PClass *)0x0);
        }
        pVVar9 = (VMValue *)(ulong)(bVar11 || bVar10);
        uVar5 = (uint)bVar10;
        if ((char)ret == '\0') {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005f9e4a;
        }
      }
      pPVar3 = AActor::RegistrationInfo.MyClass;
      if (numparam == 1) goto LAB_005f9d48;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_005f9e3a;
        puVar2 = (undefined8 *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (puVar2 != (undefined8 *)0x0) {
            pPVar7 = (PClass *)puVar2[1];
            if (pPVar7 == (PClass *)0x0) {
              pPVar7 = (PClass *)(**(code **)*puVar2)(puVar2,pVVar9,uVar5,ret);
              puVar2[1] = pPVar7;
            }
            bVar10 = pPVar7 != (PClass *)0x0;
            if (pPVar7 != pPVar3 && bVar10) {
              do {
                pPVar7 = pPVar7->ParentClass;
                bVar10 = pPVar7 != (PClass *)0x0;
                if (pPVar7 == pPVar3) break;
              } while (pPVar7 != (PClass *)0x0);
            }
            if (!bVar10) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_005f9e4a;
            }
          }
        }
        else if (puVar2 != (undefined8 *)0x0) goto LAB_005f9e3a;
      }
      if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_005f9d48:
        local_2c.ID = S_FindSound("weapons/mauler2charge");
        S_Sound(ent,1,&local_2c,1.0,1.0);
        if (ent->player != (player_t *)0x0) {
          uVar5 = FRandom::GenRand32(&pr_mauler2);
          uVar6 = FRandom::GenRand32(&pr_mauler2);
          pDVar8 = player_t::GetPSprite(ent->player,PSP_WEAPON);
          pDVar8->x = (double)(int)((uVar5 & 0xff) - (uVar6 & 0xff)) * 0.015625 + pDVar8->x;
          uVar5 = FRandom::GenRand32(&pr_mauler2);
          uVar6 = FRandom::GenRand32(&pr_mauler2);
          pDVar8 = player_t::GetPSprite(ent->player,PSP_WEAPON);
          pDVar8->y = (double)(int)((uVar5 & 0xff) - (uVar6 & 0xff)) * 0.015625 + pDVar8->y;
        }
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_005f9e4a;
    }
    if (ent == (AActor *)0x0) goto LAB_005f9c88;
  }
LAB_005f9e3a:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_005f9e4a:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                ,0x1f1,"int AF_A_FireMauler2Pre(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FireMauler2Pre)
{
	PARAM_ACTION_PROLOGUE;

	S_Sound (self, CHAN_WEAPON, "weapons/mauler2charge", 1, ATTN_NORM);

	if (self->player != nullptr)
	{
		self->player->GetPSprite(PSP_WEAPON)->x += pr_mauler2.Random2() / 64.;
		self->player->GetPSprite(PSP_WEAPON)->y += pr_mauler2.Random2() / 64.;
	}
	return 0;
}